

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_First(Super_Man_t *pMan,int nVarsMax)

{
  Super_Gate_t_conflict **ppSVar1;
  Super_Gate_t_conflict *pGate;
  int local_34;
  uint local_30;
  int local_2c;
  int m;
  int v;
  int nVarLimit;
  int nMintLimit;
  Super_Gate_t_conflict *pSuper;
  int nVarsMax_local;
  Super_Man_t *pMan_local;
  
  pMan->nVarsMax = nVarsMax;
  pMan->nMints = 1 << ((byte)nVarsMax & 0x1f);
  pMan->nLevels = 0;
  pMan->nGates = nVarsMax;
  ppSVar1 = (Super_Gate_t_conflict **)malloc((long)(nVarsMax + 2) << 3);
  pMan->pGates = ppSVar1;
  for (local_2c = 0; local_2c < nVarsMax; local_2c = local_2c + 1) {
    pGate = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
    memset(pGate,0,0x70);
    *(uint *)&pGate->field_0x8 = *(uint *)&pGate->field_0x8 & 0xfffffffe | 1;
    *(uint *)&pGate->field_0x8 = *(uint *)&pGate->field_0x8 & 0xff | local_2c << 8;
    for (local_30 = 0; (int)local_30 < nVarsMax; local_30 = local_30 + 1) {
      pGate->ptDelays[(int)local_30] = -9999.0;
    }
    pGate->ptDelays[local_2c] = 0.0;
    pMan->pGates[local_2c] = pGate;
    Super_AddGateToTable(pMan,pGate);
    pMan->pInputs[local_2c] = pGate;
  }
  local_34 = nVarsMax;
  if (4 < nVarsMax) {
    local_34 = 5;
  }
  for (local_30 = 0; (int)local_30 < 1 << ((byte)local_34 & 0x1f); local_30 = local_30 + 1) {
    for (local_2c = 0; local_2c < local_34; local_2c = local_2c + 1) {
      if ((local_30 & 1 << ((byte)local_2c & 0x1f)) != 0) {
        pMan->pGates[local_2c]->uTruth[0] =
             1 << ((byte)local_30 & 0x1f) | pMan->pGates[local_2c]->uTruth[0];
      }
    }
  }
  if (nVarsMax == 6) {
    for (local_2c = 0; local_2c < 5; local_2c = local_2c + 1) {
      pMan->pGates[local_2c]->uTruth[1] = pMan->pGates[local_2c]->uTruth[0];
    }
    pMan->pGates[5]->uTruth[0] = 0;
    pMan->pGates[5]->uTruth[1] = 0xffffffff;
  }
  else {
    for (local_2c = 0; local_2c < nVarsMax; local_2c = local_2c + 1) {
      pMan->pGates[local_2c]->uTruth[1] = 0;
    }
  }
  return;
}

Assistant:

void Super_First( Super_Man_t * pMan, int nVarsMax )
{
    Super_Gate_t * pSuper;
    int nMintLimit, nVarLimit;
    int v, m;
    // set the parameters
    pMan->nVarsMax  = nVarsMax;
    pMan->nMints    = (1 << nVarsMax);
    pMan->nLevels   = 0;
    // allocate room for the gates
    pMan->nGates    = nVarsMax;  
    pMan->pGates    = ABC_ALLOC( Super_Gate_t *, nVarsMax + 2 ); 
    // create the gates corresponding to the elementary variables
    for ( v = 0; v < nVarsMax; v++ )
    {
        // get a new gate
        pSuper = (Super_Gate_t *)Extra_MmFixedEntryFetch( pMan->pMem );
        memset( pSuper, 0, sizeof(Super_Gate_t) );
        // assign the elementary variable, the truth table, and the delays
        pSuper->fVar = 1;
        pSuper->Number = v;
        for ( m = 0; m < nVarsMax; m++ )
            pSuper->ptDelays[m] = SUPER_NO_VAR;
        pSuper->ptDelays[v] = 0.0;
        // set the gate
        pMan->pGates[v] = pSuper;
        Super_AddGateToTable( pMan, pSuper );
        pMan->pInputs[v] = pSuper;
    }
    // set up their truth tables
    nVarLimit  = (nVarsMax >= 5)? 5 : nVarsMax;
    nMintLimit = (1 << nVarLimit);
    for ( m = 0; m < nMintLimit; m++ )
        for ( v = 0; v < nVarLimit; v++ )
            if ( m & (1 << v) )
                pMan->pGates[v]->uTruth[0] |= (1 << m);
    // make adjustments for the case of 6 variables
    if ( nVarsMax == 6 )
    {
        for ( v = 0; v < 5; v++ )
            pMan->pGates[v]->uTruth[1] = pMan->pGates[v]->uTruth[0];
        pMan->pGates[5]->uTruth[0] = 0;
        pMan->pGates[5]->uTruth[1] = ~((unsigned)0);
    }
    else
    {
        for ( v = 0; v < nVarsMax; v++ )
            pMan->pGates[v]->uTruth[1] = 0;
    }
}